

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReduceMeanLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemean(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x500) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x500;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceMeanLayerParams::ReduceMeanLayerParams(this_00.reducemean_);
    (this->layer_).reducemean_ = (ReduceMeanLayerParams *)this_00;
  }
  return (ReduceMeanLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMeanLayerParams* NeuralNetworkLayer::mutable_reducemean() {
  if (!has_reducemean()) {
    clear_layer();
    set_has_reducemean();
    layer_.reducemean_ = new ::CoreML::Specification::ReduceMeanLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMean)
  return layer_.reducemean_;
}